

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O0

void __thiscall
validation_layer::basic_leakChecker::ZEbasic_leakChecker::~ZEbasic_leakChecker
          (ZEbasic_leakChecker *this)

{
  long lVar1;
  bool bVar2;
  _Setw _Var3;
  reference this_00;
  size_type sVar4;
  const_reference pvVar5;
  mapped_type *pmVar6;
  ostream *poVar7;
  __int_type_conflict1 zeCount_1;
  value_type name_1;
  ulong local_d0;
  size_t i_1;
  __int_type_conflict1 zeCount;
  value_type name;
  ulong local_98;
  size_t i;
  int64_t diff;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dtors;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ctors;
  ctorsAndDtors *s;
  iterator __end1;
  iterator __begin1;
  vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
  *__range1;
  vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_> set;
  ZEbasic_leakChecker *this_local;
  memory_order __b_1;
  memory_order __b;
  
  (this->super_ZEValidationEntryPoints)._vptr_ZEValidationEntryPoints =
       (_func_int **)&PTR_zeInitPrologue_00318b40;
  set.
  super__Vector_base<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::operator<<((ostream *)&std::cerr,"Check balance of create/destroy calls\n");
  std::operator<<((ostream *)&std::cerr,
                  "----------------------------------------------------------\n");
  createDestroySet();
  __end1 = std::
           vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
           ::begin((vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
                    *)&__range1);
  s = (ctorsAndDtors *)
      std::vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
      ::end((vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
             *)&__range1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<validation_layer::ctorsAndDtors_*,_std::vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>_>
                                     *)&s), bVar2) {
    this_00 = __gnu_cxx::
              __normal_iterator<validation_layer::ctorsAndDtors_*,_std::vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>_>
              ::operator*(&__end1);
    i = 0;
    for (local_98 = 0;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this_00->ctors), local_98 < sVar4; local_98 = local_98 + 1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this_00->ctors,local_98);
      std::__cxx11::string::string((string *)&zeCount,(string *)pvVar5);
      pmVar6 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>_>
               ::operator[](&this->counts,(key_type *)&zeCount);
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      lVar1 = (pmVar6->super___atomic_base<long>)._M_i;
      i = lVar1 + i;
      if (local_98 != 0) {
        std::operator<<((ostream *)&std::cerr," |\n");
      }
      _Var3 = std::setw(0x1e);
      poVar7 = std::operator<<((ostream *)&std::cerr,_Var3);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::right);
      std::operator<<(poVar7,(string *)&zeCount);
      std::operator<<((ostream *)&std::cerr," = ");
      _Var3 = std::setw(5);
      poVar7 = std::operator<<((ostream *)&std::cerr,_Var3);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::left);
      std::ostream::operator<<(poVar7,lVar1);
      std::__cxx11::string::~string((string *)&zeCount);
    }
    std::operator<<((ostream *)&std::cerr," \\--->");
    for (local_d0 = 0;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this_00->dtors), local_d0 < sVar4; local_d0 = local_d0 + 1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this_00->dtors,local_d0);
      std::__cxx11::string::string((string *)&zeCount_1,(string *)pvVar5);
      pmVar6 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>_>
               ::operator[](&this->counts,(key_type *)&zeCount_1);
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      lVar1 = (pmVar6->super___atomic_base<long>)._M_i;
      i = i - lVar1;
      if (local_d0 != 0) {
        std::operator<<((ostream *)&std::cerr,"\n");
        _Var3 = std::setw(0x2c);
        poVar7 = std::operator<<((ostream *)&std::cerr,_Var3);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::right);
        std::operator<<(poVar7,"\\--->");
      }
      _Var3 = std::setw(0x1e);
      poVar7 = std::operator<<((ostream *)&std::cerr,_Var3);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::right);
      std::operator<<(poVar7,(string *)&zeCount_1);
      std::operator<<((ostream *)&std::cerr," = ");
      _Var3 = std::setw(5);
      poVar7 = std::operator<<((ostream *)&std::cerr,_Var3);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::left);
      std::ostream::operator<<(poVar7,lVar1);
      std::__cxx11::string::~string((string *)&zeCount_1);
    }
    if (i != 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr," ---> LEAK = ");
      std::ostream::operator<<(poVar7,i);
    }
    std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<validation_layer::ctorsAndDtors_*,_std::vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>_>
    ::operator++(&__end1);
  }
  std::vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>::
  ~vector((vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
           *)&__range1);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>_>
  ::~unordered_map(&this->counts);
  ZEValidationEntryPoints::~ZEValidationEntryPoints(&this->super_ZEValidationEntryPoints);
  return;
}

Assistant:

basic_leakChecker::ZEbasic_leakChecker::~ZEbasic_leakChecker() {
        std::cerr << "Check balance of create/destroy calls\n";
        std::cerr << "----------------------------------------------------------\n";
        auto set = createDestroySet();
        for (const auto &s : set) {
            auto &ctors = s.ctors;
            auto &dtors = s.dtors;
            int64_t diff = 0;
            for (size_t i = 0; i < ctors.size(); i++) {
                auto name = ctors[i];
                auto zeCount = counts[name].load();
                diff += zeCount;

                if (i > 0) {
                    std::cerr << " |\n";
                }

                std::cerr << std::setw(30) << std::right << name;
                std::cerr << " = ";
                std::cerr << std::setw(5) << std::left << zeCount;
            }

            std::cerr << " \\--->";

            for (size_t i = 0; i < dtors.size(); i++) {
                auto name = dtors[i];
                auto zeCount = counts[name].load();
                diff -= zeCount;

                if (i > 0) {
                    std::cerr << "\n";
                    std::cerr << std::setw(44) << std::right << "\\--->";
                }

                std::cerr << std::setw(30) << std::right << name;
                std::cerr << " = ";
                std::cerr << std::setw(5) << std::left << zeCount;
            }

            if (diff) {
                std::cerr << " ---> LEAK = " << diff;
            }

            std::cerr << std::endl;
        }
    }